

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

shared_ptr<dlib::timer_global_clock> dlib::get_global_clock(void)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<dlib::timer_global_clock> sVar2;
  timer_global_clock *in_stack_ffffffffffffffc8;
  shared_ptr<dlib::timer_global_clock> *in_stack_ffffffffffffffd0;
  timer_global_clock *in_stack_fffffffffffffff0;
  
  if (get_global_clock()::d == '\0') {
    iVar1 = __cxa_guard_acquire(&get_global_clock()::d);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffd0 = (shared_ptr<dlib::timer_global_clock> *)operator_new(0x168);
      timer_global_clock::timer_global_clock(in_stack_fffffffffffffff0);
      std::shared_ptr<dlib::timer_global_clock>::shared_ptr<dlib::timer_global_clock,void>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      __cxa_atexit(std::shared_ptr<dlib::timer_global_clock>::~shared_ptr,&get_global_clock::d,
                   &__dso_handle);
      __cxa_guard_release(&get_global_clock()::d);
    }
  }
  std::shared_ptr<dlib::timer_global_clock>::shared_ptr
            (in_stack_ffffffffffffffd0,
             (shared_ptr<dlib::timer_global_clock> *)in_stack_ffffffffffffffc8);
  sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<dlib::timer_global_clock>)
         sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<timer_global_clock> get_global_clock()
    {
        static std::shared_ptr<timer_global_clock> d(new timer_global_clock);
        return d;
    }